

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

int xmlOutputBufferWrite(xmlOutputBufferPtr out,int len,char *buf)

{
  xmlBufPtr *ppxVar1;
  xmlBufPtr *ppxVar2;
  xmlOutputWriteCallback p_Var3;
  void *pvVar4;
  xmlBufPtr *ppxVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  xmlBufPtr pxVar9;
  size_t sVar10;
  xmlChar *pxVar11;
  int iVar12;
  ulong uVar13;
  
  iVar12 = -1;
  if ((out != (xmlOutputBufferPtr)0x0) && (out->error == 0)) {
    if (len < 0) {
      iVar12 = 0;
    }
    else {
      ppxVar1 = &out->conv;
      ppxVar2 = &out->buffer;
      iVar12 = 0;
      do {
        uVar13 = 16000;
        if ((uint)len < 16000) {
          uVar13 = (ulong)(uint)len;
        }
        uVar8 = (uint)uVar13;
        if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
          iVar6 = xmlBufAdd(*ppxVar2,(xmlChar *)buf,uVar8);
          uVar7 = uVar8;
          if (iVar6 != 0) {
            return -1;
          }
        }
        else {
          if (*ppxVar1 == (xmlBufPtr)0x0) {
            pxVar9 = xmlBufCreate();
            *ppxVar1 = pxVar9;
          }
          iVar6 = xmlBufAdd(*ppxVar2,(xmlChar *)buf,uVar8);
          if (iVar6 != 0) {
            return -1;
          }
          sVar10 = xmlBufUse(*ppxVar2);
          if (sVar10 < 4000 && (uint)len < 0x3e81) {
            return iVar12;
          }
          uVar7 = xmlCharEncOutput(out,0);
          if ((int)uVar7 < 0 && uVar7 != 0xfffffffd) {
            iVar12 = 0x608;
            uVar8 = 0xffffffff;
            goto LAB_00198b3c;
          }
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
        }
        len = len - uVar8;
        p_Var3 = out->writecallback;
        if (p_Var3 != (xmlOutputWriteCallback)0x0) {
          if (uVar7 < 4000 && len < 1) {
            return iVar12;
          }
          pvVar4 = out->context;
          if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
            pxVar11 = xmlBufContent(*ppxVar2);
            uVar8 = (*p_Var3)(pvVar4,(char *)pxVar11,uVar7);
            ppxVar5 = ppxVar2;
          }
          else {
            pxVar11 = xmlBufContent(*ppxVar1);
            uVar8 = (*p_Var3)(pvVar4,(char *)pxVar11,uVar7);
            ppxVar5 = ppxVar1;
          }
          if ((int)uVar8 < 0) {
            iVar12 = 0x60a;
LAB_00198b3c:
            xmlIOErr(iVar12,(char *)0x0);
            out->error = iVar12;
            return uVar8;
          }
          xmlBufShrink(*ppxVar5,(ulong)uVar8);
          iVar6 = out->written + uVar8;
          if ((int)(uVar8 ^ 0x7fffffff) < out->written) {
            iVar6 = 0x7fffffff;
          }
          out->written = iVar6;
        }
        buf = (char *)((xmlChar *)buf + uVar13);
        iVar12 = iVar12 + uVar7;
      } while (0 < len);
    }
  }
  return iVar12;
}

Assistant:

int
xmlOutputBufferWrite(xmlOutputBufferPtr out, int len, const char *buf) {
    int nbchars = 0; /* number of chars to output to I/O */
    int ret;         /* return from function call */
    int written = 0; /* number of char written to I/O so far */
    int chunk;       /* number of byte current processed from buf */

    if ((out == NULL) || (out->error)) return(-1);
    if (len < 0) return(0);
    if (out->error) return(-1);

    do {
	chunk = len;
	if (chunk > 4 * MINLEN)
	    chunk = 4 * MINLEN;

	/*
	 * first handle encoding stuff.
	 */
	if (out->encoder != NULL) {
	    /*
	     * Store the data in the incoming raw buffer
	     */
	    if (out->conv == NULL) {
		out->conv = xmlBufCreate();
	    }
	    ret = xmlBufAdd(out->buffer, (const xmlChar *) buf, chunk);
	    if (ret != 0)
	        return(-1);

	    if ((xmlBufUse(out->buffer) < MINLEN) && (chunk == len))
		goto done;

	    /*
	     * convert as much as possible to the parser reading buffer.
	     */
	    ret = xmlCharEncOutput(out, 0);
	    if ((ret < 0) && (ret != -3)) {
		xmlIOErr(XML_IO_ENCODER, NULL);
		out->error = XML_IO_ENCODER;
		return(-1);
	    }
            nbchars = ret >= 0 ? ret : 0;
	} else {
	    ret = xmlBufAdd(out->buffer, (const xmlChar *) buf, chunk);
	    if (ret != 0)
	        return(-1);
            nbchars = chunk;
	}
	buf += chunk;
	len -= chunk;

	if (out->writecallback) {
            if ((nbchars < MINLEN) && (len <= 0))
                goto done;

	    /*
	     * second write the stuff to the I/O channel
	     */
	    if (out->encoder != NULL) {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->conv), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->conv, ret);
	    } else {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->buffer), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->buffer, ret);
	    }
	    if (ret < 0) {
		xmlIOErr(XML_IO_WRITE, NULL);
		out->error = XML_IO_WRITE;
		return(ret);
	    }
            if (out->written > INT_MAX - ret)
                out->written = INT_MAX;
            else
                out->written += ret;
	}
	written += nbchars;
    } while (len > 0);

done:
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: wrote %d chars\n", written);
#endif
    return(written);
}